

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O0

float bez2(xr_key *key0,xr_key *key1,float time)

{
  float fVar1;
  float local_38;
  float local_34;
  float y;
  float t;
  float t1;
  float t0;
  float x;
  float time_local;
  xr_key *key1_local;
  xr_key *key0_local;
  
  if (key0->shape == '\x05') {
    local_34 = key0->time + key0->param[2];
  }
  else {
    local_34 = key0->time + (key1->time - key0->time) / 3.0;
  }
  t1 = local_34;
  t = 0.0;
  y = 1.0;
  t0 = time;
  _x = key1;
  key1_local = key0;
  fVar1 = bez2_time(key0->time,local_34,key1->time + key1->param[0],key1->time,time,&t,&y);
  if (key1_local->shape == '\x05') {
    local_38 = key1_local->value + key1_local->param[3];
  }
  else {
    local_38 = key1_local->value + key1_local->param[1] / 3.0;
  }
  fVar1 = bezier(key1_local->value,local_38,_x->param[1] + _x->value,_x->value,fVar1);
  return fVar1;
}

Assistant:

static float bez2(const xr_key* key0, const xr_key* key1, float time)
{
	float x = (key0->shape == xr_key::SHAPE_BEZ2) ?
			key0->time + key0->param[2] :
			key0->time + (key1->time - key0->time)/3.f;
	float t0 = 0.f, t1 = 1.f;
	float t = bez2_time(key0->time, x, key1->time + key1->param[0], key1->time, time, &t0, &t1);

	float y = (key0->shape == xr_key::SHAPE_BEZ2) ?
			key0->value + key0->param[3] :
			key0->value + key0->param[1]/3.f;
	return bezier(key0->value, y, key1->param[1] + key1->value, key1->value, t);
}